

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O0

void png_set_user_limits(png_structrp png_ptr,png_uint_32 user_width_max,png_uint_32 user_height_max
                        )

{
  png_uint_32 user_height_max_local;
  png_uint_32 user_width_max_local;
  png_structrp png_ptr_local;
  
  if (png_ptr != (png_structrp)0x0) {
    png_ptr->user_width_max = user_width_max;
    png_ptr->user_height_max = user_height_max;
  }
  return;
}

Assistant:

void PNGAPI
png_set_user_limits (png_structrp png_ptr, png_uint_32 user_width_max,
    png_uint_32 user_height_max)
{
   /* Images with dimensions larger than these limits will be
    * rejected by png_set_IHDR().  To accept any PNG datastream
    * regardless of dimensions, set both limits to 0x7fffffff.
    */
   if (png_ptr == NULL)
      return;

   png_ptr->user_width_max = user_width_max;
   png_ptr->user_height_max = user_height_max;
}